

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O2

void __thiscall avro::NodeFixed::printJson(NodeFixed *this,ostream *os,int depth)

{
  indent x;
  ostream *poVar1;
  
  std::operator<<(os,"{\n");
  x.d = depth + 1;
  operator<<(os,x);
  std::operator<<(os,"\"type\": \"fixed\",\n");
  printName(os,&(this->super_NodeImplFixed).nameAttribute_.attr_,x.d);
  operator<<(os,x);
  poVar1 = std::operator<<(os,"\"size\": ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->super_NodeImplFixed).sizeAttribute_.attr_);
  std::operator<<(poVar1,"\n");
  operator<<(os,(indent)depth);
  std::operator<<(os,'}');
  return;
}

Assistant:

void 
NodeFixed::printJson(std::ostream &os, int depth) const
{
    os << "{\n";
    os << indent(++depth) << "\"type\": \"fixed\",\n";
    printName(os, nameAttribute_.get(), depth);
    os << indent(depth) << "\"size\": " << sizeAttribute_.get() << "\n";
    os << indent(--depth) << '}';
}